

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_print.c
# Opt level: O0

double pow_10(int in_exp)

{
  double result;
  int in_exp_local;
  
  result = 1.0;
  for (in_exp_local = in_exp; in_exp_local != 0; in_exp_local = in_exp_local + -1) {
    result = result * 10.0;
  }
  return result;
}

Assistant:

static LDOUBLE pow_10(int in_exp)
{
    LDOUBLE result = 1;
    while (in_exp) {
        result *= 10;
        in_exp--;
    }
    return result;
}